

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O1

bool __thiscall
Ptex::v2_2::PtexUtils::anon_unknown_1::CompareRfaceIds::operator()
          (CompareRfaceIds *this,uint32_t faceid1,uint32_t faceid2)

{
  FaceInfo *pFVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  FaceInfo *pFVar4;
  char cVar5;
  char cVar6;
  
  pFVar4 = this->faces;
  pFVar1 = pFVar4 + faceid2;
  cVar6 = '\x01';
  if ((pFVar4[faceid1].flags & 1) == 0) {
    uVar2 = pFVar4[faceid1].res.ulog2;
    cVar6 = pFVar4[faceid1].res.vlog2;
    if ((char)uVar2 < cVar6) {
      cVar6 = uVar2;
    }
  }
  cVar5 = '\x01';
  if ((pFVar1->flags & 1) == 0) {
    uVar3 = (pFVar1->res).ulog2;
    cVar5 = (pFVar1->res).vlog2;
    if ((char)uVar3 < cVar5) {
      cVar5 = uVar3;
    }
  }
  return cVar5 < cVar6;
}

Assistant:

bool operator() (uint32_t faceid1, uint32_t faceid2)
        {
            const Ptex::FaceInfo& f1 = faces[faceid1];
            const Ptex::FaceInfo& f2 = faces[faceid2];
            int min1 = f1.isConstant() ? 1 : PtexUtils::min(f1.res.ulog2, f1.res.vlog2);
            int min2 = f2.isConstant() ? 1 : PtexUtils::min(f2.res.ulog2, f2.res.vlog2);
            return min1 > min2;
        }